

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O1

int aom_rb_read_bit(aom_read_bit_buffer *rb)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = rb->bit_offset;
  if (rb->bit_buffer + (uVar1 >> 3) < rb->bit_buffer_end) {
    uVar2 = (uint)((rb->bit_buffer[uVar1 >> 3] >> (~(byte)uVar1 & 7) & 1) != 0);
    rb->bit_offset = uVar1 + 1;
  }
  else {
    uVar2 = 0;
    if (rb->error_handler != (aom_rb_error_handler)0x0) {
      (*rb->error_handler)(rb->error_handler_data);
    }
  }
  return uVar2;
}

Assistant:

int aom_rb_read_bit(struct aom_read_bit_buffer *rb) {
  const uint32_t off = rb->bit_offset;
  const uint32_t p = off >> 3;
  const int q = 7 - (int)(off & 0x7);
  if (rb->bit_buffer + p < rb->bit_buffer_end) {
    const int bit = (rb->bit_buffer[p] >> q) & 1;
    rb->bit_offset = off + 1;
    return bit;
  } else {
    if (rb->error_handler) rb->error_handler(rb->error_handler_data);
    return 0;
  }
}